

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_quads.cpp
# Opt level: O1

void __thiscall CLayerQuads::BrushPlace(CLayerQuads *this,CLayer *pBrush,float wx,float wy)

{
  int p;
  long lVar1;
  long lVar2;
  long in_FS_OFFSET;
  CPoint CVar3;
  CQuad n;
  CQuad local_c8;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (0 < *(int *)(pBrush[1].m_aName + 4)) {
    lVar2 = 0;
    do {
      memcpy(&local_c8,(void *)((long)&(pBrush[1].m_pEditor)->super_IEditor + lVar2 * 0x98),0x98);
      lVar1 = 0;
      do {
        CVar3.x = local_c8.m_aPoints[lVar1].x + (int)(wx * 1024.0);
        CVar3.y = local_c8.m_aPoints[lVar1].y + (int)(wy * 1024.0);
        local_c8.m_aPoints[lVar1] = CVar3;
        lVar1 = lVar1 + 1;
      } while (lVar1 != 5);
      array<CQuad,_allocator_default<CQuad>_>::add(&this->m_lQuads,&local_c8);
      lVar2 = lVar2 + 1;
    } while (lVar2 < *(int *)(pBrush[1].m_aName + 4));
  }
  (((this->super_CLayer).m_pEditor)->m_Map).m_Modified = true;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CLayerQuads::BrushPlace(CLayer *pBrush, float wx, float wy)
{
	CLayerQuads *l = (CLayerQuads *)pBrush;
	for(int i = 0; i < l->m_lQuads.size(); i++)
	{
		CQuad n = l->m_lQuads[i];

		for(int p = 0; p < 5; p++)
		{
			n.m_aPoints[p].x += f2fx(wx);
			n.m_aPoints[p].y += f2fx(wy);
		}

		m_lQuads.add(n);
	}
	m_pEditor->m_Map.m_Modified = true;
}